

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

void __thiscall
kratos::PortPackedStruct::PortPackedStruct
          (PortPackedStruct *this,Generator *m,PortDirection direction,string *name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,uint32_t size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  Port::Port(&this->super_Port,m,direction,name,1,size,Data,false);
  (this->super_Port).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002aeea8;
  (this->super_PackedInterface)._vptr_PackedInterface = (_func_int **)&DAT_002af030;
  (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->struct_).super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (packed_struct_->super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  setup_size(this);
  return;
}

Assistant:

PortPackedStruct::PortPackedStruct(Generator* m, PortDirection direction, const std::string& name,
                                   std::shared_ptr<PackedStruct> packed_struct_, uint32_t size)
    : Port(m, direction, name, 1, size, PortType::Data, false), struct_(std::move(packed_struct_)) {
    setup_size();
}